

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_widget_has_mouse_click_down(nk_context *ctx,nk_buttons btn,int down)

{
  int iVar1;
  nk_rect bounds;
  nk_rect local_28;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x48c3,
                  "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
  }
  if (ctx->current != (nk_window *)0x0) {
    nk_layout_peek(&local_28,ctx);
    iVar1 = 0;
    if (ctx->active == ctx->current) {
      iVar1 = nk_input_has_mouse_click_down_in_rect(&ctx->input,btn,local_28,down);
    }
    return iVar1;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x48c4,
                "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
}

Assistant:

NK_API int
nk_widget_has_mouse_click_down(struct nk_context *ctx, enum nk_buttons btn, int down)
{
    int ret;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    ret = (ctx->active == ctx->current);
    ret = ret && nk_input_has_mouse_click_down_in_rect(&ctx->input, btn, bounds, down);
    return ret;
}